

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupTimes(Gia_Man_t *p,int nTimes)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  bool bVar5;
  int local_50;
  int Entry;
  int t;
  int i;
  Vec_Int_t *vRos;
  Vec_Int_t *vRis;
  Vec_Int_t *vPos;
  Vec_Int_t *vPis;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int nTimes_local;
  Gia_Man_t *p_local;
  
  if (0 < nTimes) {
    iVar1 = Gia_ManObjNum(p);
    p_00 = Gia_ManStart(iVar1);
    pcVar3 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar3;
    pGVar4 = Gia_ManConst0(p);
    pGVar4->Value = 0;
    iVar1 = Gia_ManPiNum(p);
    p_01 = Vec_IntAlloc(iVar1 * nTimes);
    iVar1 = Gia_ManPoNum(p);
    p_02 = Vec_IntAlloc(iVar1 * nTimes);
    iVar1 = Gia_ManRegNum(p);
    p_03 = Vec_IntAlloc(iVar1 * nTimes);
    iVar1 = Gia_ManRegNum(p);
    p_04 = Vec_IntAlloc(iVar1 * nTimes);
    for (local_50 = 0; local_50 < nTimes; local_50 = local_50 + 1) {
      Entry = 1;
      while( true ) {
        bVar5 = false;
        if (Entry < p->nObjs) {
          vPis = (Vec_Int_t *)Gia_ManObj(p,Entry);
          bVar5 = vPis != (Vec_Int_t *)0x0;
        }
        if (!bVar5) break;
        iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)vPis);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsCi((Gia_Obj_t *)vPis);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjIsCo((Gia_Obj_t *)vPis);
            if (iVar1 != 0) {
              iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)vPis);
              iVar1 = Gia_ManAppendCo(p_00,iVar1);
              *(int *)&vPis->pArray = iVar1;
              iVar1 = Gia_ObjIsPo(p,(Gia_Obj_t *)vPis);
              if (iVar1 == 0) {
                iVar1 = Abc_Lit2Var(*(int *)&vPis->pArray);
                Vec_IntPush(p_03,iVar1);
              }
              else {
                iVar1 = Abc_Lit2Var(*(int *)&vPis->pArray);
                Vec_IntPush(p_02,iVar1);
              }
            }
          }
          else {
            iVar1 = Gia_ManAppendCi(p_00);
            *(int *)&vPis->pArray = iVar1;
            iVar1 = Gia_ObjIsPi(p,(Gia_Obj_t *)vPis);
            if (iVar1 == 0) {
              iVar1 = Abc_Lit2Var(*(int *)&vPis->pArray);
              Vec_IntPush(p_04,iVar1);
            }
            else {
              iVar1 = Abc_Lit2Var(*(int *)&vPis->pArray);
              Vec_IntPush(p_01,iVar1);
            }
          }
        }
        else {
          iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)vPis);
          iVar2 = Gia_ObjFanin1Copy((Gia_Obj_t *)vPis);
          iVar1 = Gia_ManAppendAnd(p_00,iVar1,iVar2);
          *(int *)&vPis->pArray = iVar1;
        }
        Entry = Entry + 1;
      }
    }
    Vec_IntClear(p_00->vCis);
    for (Entry = 0; iVar1 = Vec_IntSize(p_01), Entry < iVar1; Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(p_01,Entry);
      pGVar4 = Gia_ManObj(p_00,iVar1);
      iVar2 = Vec_IntSize(p_00->vCis);
      Gia_ObjSetCioId(pGVar4,iVar2);
      Vec_IntPush(p_00->vCis,iVar1);
    }
    for (Entry = 0; iVar1 = Vec_IntSize(p_04), Entry < iVar1; Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(p_04,Entry);
      pGVar4 = Gia_ManObj(p_00,iVar1);
      iVar2 = Vec_IntSize(p_00->vCis);
      Gia_ObjSetCioId(pGVar4,iVar2);
      Vec_IntPush(p_00->vCis,iVar1);
    }
    Vec_IntClear(p_00->vCos);
    for (Entry = 0; iVar1 = Vec_IntSize(p_02), Entry < iVar1; Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(p_02,Entry);
      pGVar4 = Gia_ManObj(p_00,iVar1);
      iVar2 = Vec_IntSize(p_00->vCos);
      Gia_ObjSetCioId(pGVar4,iVar2);
      Vec_IntPush(p_00->vCos,iVar1);
    }
    for (Entry = 0; iVar1 = Vec_IntSize(p_03), Entry < iVar1; Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(p_03,Entry);
      pGVar4 = Gia_ManObj(p_00,iVar1);
      iVar2 = Vec_IntSize(p_00->vCos);
      Gia_ObjSetCioId(pGVar4,iVar2);
      Vec_IntPush(p_00->vCos,iVar1);
    }
    Vec_IntFree(p_01);
    Vec_IntFree(p_02);
    Vec_IntFree(p_03);
    Vec_IntFree(p_04);
    iVar1 = Gia_ManRegNum(p);
    Gia_ManSetRegNum(p_00,nTimes * iVar1);
    return p_00;
  }
  __assert_fail("nTimes > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                ,0x569,"Gia_Man_t *Gia_ManDupTimes(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupTimes( Gia_Man_t * p, int nTimes )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vPis, * vPos, * vRis, * vRos;
    int i, t, Entry;
    assert( nTimes > 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    vPis = Vec_IntAlloc( Gia_ManPiNum(p) * nTimes );
    vPos = Vec_IntAlloc( Gia_ManPoNum(p) * nTimes );
    vRis = Vec_IntAlloc( Gia_ManRegNum(p) * nTimes );
    vRos = Vec_IntAlloc( Gia_ManRegNum(p) * nTimes );
    for ( t = 0; t < nTimes; t++ )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsAnd(pObj) )
                pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            else if ( Gia_ObjIsCi(pObj) )
            {
                pObj->Value = Gia_ManAppendCi( pNew );
                if ( Gia_ObjIsPi(p, pObj) )
                    Vec_IntPush( vPis, Abc_Lit2Var(pObj->Value) );
                else
                    Vec_IntPush( vRos, Abc_Lit2Var(pObj->Value) );
            }
            else if ( Gia_ObjIsCo(pObj) )
            {
                pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                if ( Gia_ObjIsPo(p, pObj) )
                    Vec_IntPush( vPos, Abc_Lit2Var(pObj->Value) );
                else
                    Vec_IntPush( vRis, Abc_Lit2Var(pObj->Value) );
            }
        }
    }
    Vec_IntClear( pNew->vCis );
    Vec_IntForEachEntry( vPis, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCis) );
        Vec_IntPush( pNew->vCis, Entry );
    }
    Vec_IntForEachEntry( vRos, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCis) );
        Vec_IntPush( pNew->vCis, Entry );
    }
    Vec_IntClear( pNew->vCos );
    Vec_IntForEachEntry( vPos, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCos) );
        Vec_IntPush( pNew->vCos, Entry );
    }
    Vec_IntForEachEntry( vRis, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCos) );
        Vec_IntPush( pNew->vCos, Entry );
    }
    Vec_IntFree( vPis );
    Vec_IntFree( vPos );
    Vec_IntFree( vRis );
    Vec_IntFree( vRos );
    Gia_ManSetRegNum( pNew, nTimes * Gia_ManRegNum(p) );
    return pNew;
}